

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_trompeloeil.hpp
# Opt level: O1

void trompeloeil::reporter<trompeloeil::specialized>::sendOk
               (char *trompeloeil_mock_calls_done_correctly)

{
  long in_RDI;
  undefined4 local_94;
  long local_90;
  AssertionHandler local_88;
  undefined **local_40;
  undefined1 local_38;
  undefined1 local_37;
  long *local_30;
  char *local_28;
  undefined8 local_20;
  undefined4 *local_18;
  
  local_88.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_88.m_assertionInfo.macroName.m_size = 7;
  local_88.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Catch2/catch_trompeloeil.hpp"
  ;
  local_88.m_assertionInfo.lineInfo.line = 0x35;
  local_88.m_assertionInfo.capturedExpression.m_start = "trompeloeil_mock_calls_done_correctly != 0"
  ;
  local_88.m_assertionInfo.capturedExpression.m_size = 0x2a;
  local_88.m_assertionInfo.resultDisposition = Normal;
  local_88.m_reaction.shouldDebugBreak = false;
  local_88.m_reaction.shouldThrow = false;
  local_88.m_completed = false;
  local_90 = in_RDI;
  local_88.m_resultCapture = Catch::getResultCapture();
  local_18 = &local_94;
  local_94 = 0;
  local_37 = local_90 != 0;
  local_38 = 1;
  local_40 = &PTR_streamReconstructedExpression_0018b108;
  local_28 = "!=";
  local_20 = 2;
  local_30 = &local_90;
  (*(local_88.m_resultCapture)->_vptr_IResultCapture[10])
            (local_88.m_resultCapture,&local_88,&local_40,&local_88.m_reaction);
  Catch::AssertionHandler::complete(&local_88);
  if (local_88.m_completed == false) {
    (*(local_88.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  return;
}

Assistant:

inline void reporter<specialized>::sendOk(
    const char* trompeloeil_mock_calls_done_correctly)
  {      
      REQUIRE(trompeloeil_mock_calls_done_correctly != 0);
  }